

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

ostream * __thiscall
wasm::anon_unknown_0::TypePrinter::print
          (TypePrinter *this,Array *array,optional<wasm::HeapType> super)

{
  bool bVar1;
  HeapType *pHVar2;
  ostream *poVar3;
  Array *array_local;
  TypePrinter *this_local;
  optional<wasm::HeapType> super_local;
  
  this_local = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
  super_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  std::operator<<(this->os,"(array");
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (bVar1) {
    std::operator<<(this->os,"_subtype");
  }
  std::operator<<(this->os,' ');
  print(this,&array->element);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (bVar1) {
    std::operator<<(this->os,' ');
    pHVar2 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&this_local);
    printHeapTypeName(this,(HeapType)pHVar2->id);
  }
  poVar3 = std::operator<<(this->os,')');
  return poVar3;
}

Assistant:

std::ostream& TypePrinter::print(const Array& array,
                                 std::optional<HeapType> super) {
  os << "(array";
  if (super) {
    os << "_subtype";
  }
  os << ' ';
  print(array.element);
  if (super) {
    os << ' ';
    printHeapTypeName(*super);
  }
  return os << ')';
}